

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parse.cc
# Opt level: O3

int re2::Regexp::FactorAlternation(Regexp **sub,int nsub,ParseFlags flags)

{
  vector<re2::Splice,_std::allocator<re2::Splice>_> *splices;
  pointer pSVar1;
  pointer pFVar2;
  ParseFlags PVar3;
  Regexp *pRVar4;
  uint uVar5;
  Regexp **ppRVar7;
  ulong uVar8;
  pointer pSVar9;
  ParseFlags flags_00;
  pointer extraout_RDX;
  pointer extraout_RDX_00;
  long lVar10;
  Regexp *pRVar11;
  pointer pSVar12;
  int nsuffix;
  Regexp **ppRVar13;
  Regexp **sub_00;
  int iVar14;
  int iVar15;
  ulong uVar16;
  vector<re2::Frame,_std::allocator<re2::Frame>_> stk;
  Regexp *re [2];
  vector<re2::Frame,_std::allocator<re2::Frame>_> local_1e8;
  int local_1c4;
  Regexp **local_1c0;
  LogMessage local_1b8;
  int iVar6;
  
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_1c4 = nsub;
  local_1c0 = sub;
  std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
            ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&local_1c0,&local_1c4);
  pSVar12 = extraout_RDX;
LAB_002333a5:
  do {
    pFVar2 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
    flags_00 = (ParseFlags)pSVar12;
    pSVar12 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].splices.
              super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
              super__Vector_impl_data._M_start;
    pSVar9 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish[-1].splices.
             super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
             super__Vector_impl_data._M_finish;
    if (pSVar12 != pSVar9) {
      iVar15 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
               super__Vector_impl_data._M_finish[-1].spliceidx;
      iVar14 = (int)((ulong)((long)pSVar9 - (long)pSVar12) >> 3);
      flags_00 = iVar14 * -0x55555555;
      if (SBORROW4(iVar15,flags_00) != iVar15 + iVar14 * 0x55555555 < 0) {
        std::vector<re2::Frame,std::allocator<re2::Frame>>::emplace_back<re2::Regexp**&,int&>
                  ((vector<re2::Frame,std::allocator<re2::Frame>> *)&local_1e8,&pSVar12[iVar15].sub,
                   &pSVar12[iVar15].nsub);
        pSVar12 = extraout_RDX_00;
        goto LAB_002333a5;
      }
      PVar3 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
              super__Vector_impl_data._M_finish[-1].nsub;
      if ((int)PVar3 < 1) {
        iVar15 = 0;
      }
      else {
        iVar14 = 0;
        uVar16 = 0;
        do {
          ppRVar7 = pFVar2[-1].sub;
          ppRVar13 = ppRVar7 + iVar14;
          sub_00 = pSVar12->sub;
          if (ppRVar13 < sub_00) {
            uVar16 = (ulong)(int)uVar16;
            lVar10 = (long)iVar14 << 3;
            do {
              ppRVar7[uVar16] = *ppRVar13;
              uVar16 = uVar16 + 1;
              ppRVar7 = pFVar2[-1].sub;
              ppRVar13 = (Regexp **)((long)ppRVar7 + lVar10 + 8);
              sub_00 = pSVar12->sub;
              iVar14 = iVar14 + 1;
              lVar10 = lVar10 + 8;
            } while (ppRVar13 < sub_00);
          }
          iVar15 = (int)uVar16;
          if (pFVar2[-1].round - 1U < 2) {
            local_1b8._0_8_ = pSVar12->prefix;
            local_1b8.str_.super_basic_ostream<char,_std::char_traits<char>_>._vptr_basic_ostream =
                 (_func_int **)AlternateNoFactor(sub_00,pSVar12->nsuffix,flags);
            pRVar4 = Concat((Regexp **)&local_1b8,2,flags);
            pRVar11 = (Regexp *)(long)iVar15;
            pFVar2[-1].sub[(long)pRVar11] = pRVar4;
            iVar6 = pSVar12->nsub;
            PVar3 = pFVar2[-1].nsub;
          }
          else {
            if (pFVar2[-1].round != 3) {
              LogMessage::LogMessage
                        (&local_1b8,
                         "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/parse.cc"
                         ,0x3d3);
              std::__ostream_insert<char,std::char_traits<char>>
                        (&local_1b8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                         "unknown round: ",0xf);
              std::ostream::operator<<(&local_1b8.str_,pFVar2[-1].round);
              goto LAB_00233692;
            }
            pRVar11 = pSVar12->prefix;
            ppRVar7[iVar15] = pRVar11;
            iVar6 = pSVar12->nsub;
          }
          uVar5 = iVar6 + iVar14;
          uVar8 = (ulong)uVar5;
          uVar16 = (ulong)(iVar15 + 1U);
          pSVar12 = pSVar12 + 1;
          flags_00 = (ParseFlags)pRVar11;
          if ((pSVar12 ==
               pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
               _M_impl.super__Vector_impl_data._M_finish) && ((int)uVar5 < (int)PVar3)) {
            uVar8 = (ulong)(int)uVar5;
            uVar16 = (ulong)(int)(iVar15 + 1U);
            do {
              ppRVar13 = pFVar2[-1].sub + uVar8;
              uVar8 = uVar8 + 1;
              pFVar2[-1].sub[uVar16] = *ppRVar13;
              uVar16 = uVar16 + 1;
              flags_00 = PVar3;
            } while ((long)uVar8 < (long)(int)PVar3);
          }
          iVar15 = (int)uVar16;
          iVar14 = (int)uVar8;
        } while (iVar14 < (int)PVar3);
        pSVar12 = pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                  _M_impl.super__Vector_impl_data._M_start;
        pSVar9 = pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                 _M_impl.super__Vector_impl_data._M_finish;
      }
      if (pSVar9 != pSVar12) {
        pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
        super__Vector_impl_data._M_finish = pSVar12;
      }
      pFVar2[-1].nsub = iVar15;
    }
    uVar5 = pFVar2[-1].round;
    pFVar2[-1].round = uVar5 + 1;
    if (3 < uVar5) {
      LogMessage::LogMessage
                (&local_1b8,
                 "/workspace/llm4binary/github/license_c_cmakelists/microsoft[P]verona/build_O3/_deps/re2-src/re2/parse.cc"
                 ,0x3fa);
      std::__ostream_insert<char,std::char_traits<char>>
                (&local_1b8.str_.super_basic_ostream<char,_std::char_traits<char>_>,
                 "unknown round: ",0xf);
      std::ostream::operator<<(&local_1b8.str_,pFVar2[-1].round);
LAB_00233692:
      LogMessageFatal::~LogMessageFatal((LogMessageFatal *)&local_1b8);
    }
    splices = &pFVar2[-1].splices;
    switch(uVar5) {
    case 0:
      FactorAlternationImpl::Round1(pFVar2[-1].sub,pFVar2[-1].nsub,flags_00,splices);
      break;
    case 1:
      FactorAlternationImpl::Round2(pFVar2[-1].sub,pFVar2[-1].nsub,flags_00,splices);
      break;
    case 2:
      FactorAlternationImpl::Round3(pFVar2[-1].sub,pFVar2[-1].nsub,flags,splices);
      break;
    case 3:
      goto switchD_0023353b_caseD_3;
    }
    pSVar9 = pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_start;
    pSVar1 = pFVar2[-1].splices.super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
             _M_impl.super__Vector_impl_data._M_finish;
    if ((pSVar9 == pSVar1) || (pSVar12 = (pointer)0x0, pFVar2[-1].round == 3)) {
      pSVar12 = (pointer)(ulong)(uint)((int)((ulong)((long)pSVar1 - (long)pSVar9) >> 3) *
                                      -0x55555555);
    }
    pFVar2[-1].spliceidx = (int)pSVar12;
  } while( true );
switchD_0023353b_caseD_3:
  iVar15 = pFVar2[-1].nsub;
  if ((long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_start == 0x30) {
    std::vector<re2::Frame,_std::allocator<re2::Frame>_>::~vector(&local_1e8);
    return iVar15;
  }
  pSVar12 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].splices.
            super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
            super__Vector_impl_data._M_start;
  pFVar2 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish + -1;
  if (pSVar12 != (pointer)0x0) {
    pFVar2 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish + -1;
    local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
    super__Vector_impl_data._M_finish =
         local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
         super__Vector_impl_data._M_finish + -1;
    operator_delete(pSVar12,(long)(pFVar2->splices).
                                  super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage - (long)pSVar12)
    ;
    pFVar2 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
             super__Vector_impl_data._M_finish;
  }
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish = pFVar2;
  iVar14 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish[-1].spliceidx;
  pSVar12 = local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
            super__Vector_impl_data._M_finish[-1].splices.
            super__Vector_base<re2::Splice,_std::allocator<re2::Splice>_>._M_impl.
            super__Vector_impl_data._M_start;
  pSVar12[iVar14].nsuffix = iVar15;
  local_1e8.super__Vector_base<re2::Frame,_std::allocator<re2::Frame>_>._M_impl.
  super__Vector_impl_data._M_finish[-1].spliceidx = iVar14 + 1;
  goto LAB_002333a5;
}

Assistant:

int Regexp::FactorAlternation(Regexp** sub, int nsub, ParseFlags flags) {
  std::vector<Frame> stk;
  stk.emplace_back(sub, nsub);

  for (;;) {
    auto& sub = stk.back().sub;
    auto& nsub = stk.back().nsub;
    auto& round = stk.back().round;
    auto& splices = stk.back().splices;
    auto& spliceidx = stk.back().spliceidx;

    if (splices.empty()) {
      // Advance to the next round of factoring. Note that this covers
      // the initialised state: when splices is empty and round is 0.
      round++;
    } else if (spliceidx < static_cast<int>(splices.size())) {
      // We have at least one more Splice to factor. Recurse logically.
      stk.emplace_back(splices[spliceidx].sub, splices[spliceidx].nsub);
      continue;
    } else {
      // We have no more Splices to factor. Apply them.
      auto iter = splices.begin();
      int out = 0;
      for (int i = 0; i < nsub; ) {
        // Copy until we reach where the next Splice begins.
        while (sub + i < iter->sub)
          sub[out++] = sub[i++];
        switch (round) {
          case 1:
          case 2: {
            // Assemble the Splice prefix and the suffixes.
            Regexp* re[2];
            re[0] = iter->prefix;
            re[1] = Regexp::AlternateNoFactor(iter->sub, iter->nsuffix, flags);
            sub[out++] = Regexp::Concat(re, 2, flags);
            i += iter->nsub;
            break;
          }
          case 3:
            // Just use the Splice prefix.
            sub[out++] = iter->prefix;
            i += iter->nsub;
            break;
          default:
            LOG(DFATAL) << "unknown round: " << round;
            break;
        }
        // If we are done, copy until the end of sub.
        if (++iter == splices.end()) {
          while (i < nsub)
            sub[out++] = sub[i++];
        }
      }
      splices.clear();
      nsub = out;
      // Advance to the next round of factoring.
      round++;
    }

    switch (round) {
      case 1:
        FactorAlternationImpl::Round1(sub, nsub, flags, &splices);
        break;
      case 2:
        FactorAlternationImpl::Round2(sub, nsub, flags, &splices);
        break;
      case 3:
        FactorAlternationImpl::Round3(sub, nsub, flags, &splices);
        break;
      case 4:
        if (stk.size() == 1) {
          // We are at the top of the stack. Just return.
          return nsub;
        } else {
          // Pop the stack and set the number of suffixes.
          // (Note that references will be invalidated!)
          int nsuffix = nsub;
          stk.pop_back();
          stk.back().splices[stk.back().spliceidx].nsuffix = nsuffix;
          ++stk.back().spliceidx;
          continue;
        }
      default:
        LOG(DFATAL) << "unknown round: " << round;
        break;
    }

    // Set spliceidx depending on whether we have Splices to factor.
    if (splices.empty() || round == 3) {
      spliceidx = static_cast<int>(splices.size());
    } else {
      spliceidx = 0;
    }
  }
}